

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdSetTapScriptByWitnessStack
              (void *handle,void *tree_handle,char *control_block,char *tapscript,
              char **internal_pubkey)

{
  pointer pcVar1;
  TaprootScriptTree *this;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer pBVar5;
  bool bVar6;
  char *pcVar7;
  CfdException *pCVar8;
  ByteData256 *node;
  pointer commitment;
  undefined8 *puVar9;
  uint8_t leaf_version;
  char *work_internal_pubkey;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SchnorrPubkey internal_pubkey_obj;
  TaprootScriptTree new_tree;
  Script tapscript_obj;
  uint8_t local_189;
  void *local_188;
  char *local_180;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_178;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_158;
  SchnorrPubkey local_138;
  undefined1 local_120 [128];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a0;
  string local_88;
  Script local_68;
  
  local_180 = (char *)0x0;
  local_188 = handle;
  cfd::Initialize();
  pcVar1 = local_120 + 0x10;
  local_120._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)local_120);
  if ((pointer)local_120._0_8_ != pcVar1) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  bVar6 = cfd::capi::IsEmptyString(control_block);
  if (bVar6) {
    local_120._0_8_ = "cfdcapi_script.cpp";
    local_120._8_4_ = 0x2c0;
    local_120._16_8_ = "CfdSetTapScriptByWitnessStack";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_120,kCfdLogLevelWarning,"control_block is null or empty.")
    ;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"Failed to parameter. control_block is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_120);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar6 = cfd::capi::IsEmptyString(tapscript);
  if (bVar6) {
    local_120._0_8_ = "cfdcapi_script.cpp";
    local_120._8_4_ = 0x2c6;
    local_120._16_8_ = "CfdSetTapScriptByWitnessStack";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_120,kCfdLogLevelWarning,"tapscript is null or empty.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"Failed to parameter. tapscript is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_120);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
  if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  local_189 = '\0';
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_138);
  local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (ByteData256 *)0x0;
  local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ByteData256 *)0x0;
  local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_68);
  local_178.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_120,tapscript,(allocator *)&local_88);
  std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
  emplace_back<std::__cxx11::string>
            ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  std::__cxx11::string::string((string *)local_120,control_block,(allocator *)&local_88);
  std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
  emplace_back<std::__cxx11::string>
            ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  cfd::core::TaprootUtil::ParseTaprootSignData
            (&local_178,(SchnorrSignature *)0x0,(bool *)0x0,&local_189,&local_138,&local_158,
             &local_68,(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0,
             (ByteData *)0x0);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_120,local_189,&local_68,
             *(NetType *)((long)tree_handle + 0x20));
  pBVar5 = local_158.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    commitment = local_158.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_120,commitment);
      commitment = commitment + 1;
    } while (commitment != pBVar5);
  }
  if (internal_pubkey == (char **)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_88,&local_138);
    pcVar7 = cfd::capi::CreateString(&local_88);
    local_180 = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  cfd::core::TaprootScriptTree::operator=(this,(TaprootScriptTree *)local_120);
  plVar2 = *(long **)((long)tree_handle + 0x18);
  puVar3 = (undefined8 *)*plVar2;
  puVar4 = (undefined8 *)plVar2[1];
  puVar9 = puVar3;
  if (puVar4 != puVar3) {
    do {
      (**(code **)*puVar9)(puVar9);
      puVar9 = puVar9 + 0x10;
    } while (puVar9 != puVar4);
    plVar2[1] = (long)puVar3;
  }
  if (internal_pubkey != (char **)0x0) {
    *internal_pubkey = pcVar7;
  }
  local_120._0_8_ = &PTR__TaprootScriptTree_008795a8;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_120);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_178);
  cfd::core::Script::~Script(&local_68);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_158);
  if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdSetTapScriptByWitnessStack(
    void* handle, void* tree_handle, const char* control_block,
    const char* tapscript, char** internal_pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_internal_pubkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(control_block)) {
      warn(CFD_LOG_SOURCE, "control_block is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. control_block is null or empty.");
    }
    if (IsEmptyString(tapscript)) {
      warn(CFD_LOG_SOURCE, "tapscript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tapscript is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    auto& tree = buffer->tree_buffer->at(0);

    uint8_t leaf_version = 0;
    SchnorrPubkey internal_pubkey_obj;
    std::vector<ByteData256> nodes;
    Script tapscript_obj;
    std::vector<ByteData> witness_stack;
    witness_stack.emplace_back(std::string(tapscript));
    witness_stack.emplace_back(std::string(control_block));
    TaprootUtil::ParseTaprootSignData(
        witness_stack, nullptr, nullptr, &leaf_version, &internal_pubkey_obj,
        &nodes, &tapscript_obj);
    TaprootScriptTree new_tree(leaf_version, tapscript_obj, buffer->net_type);
    for (const auto& node : nodes) new_tree.AddBranch(node);

    if (internal_pubkey != nullptr) {
      work_internal_pubkey = CreateString(internal_pubkey_obj.GetHex());
    }

    tree = new_tree;
    buffer->branch_buffer->clear();
    if (internal_pubkey != nullptr) *internal_pubkey = work_internal_pubkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_internal_pubkey);
  return result;
}